

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

rc_size __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  rc_data *prVar4;
  rc_size rVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 in_XMM3_Qb;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  rVar5.r_size = 0;
  rVar5.c_size = 0;
  if (begin != end) {
    uVar6 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        dVar10 = 0.0;
        dVar8 = 0.0;
      }
      else {
        auVar9 = ZEXT816(0);
        auVar7 = ZEXT816(0);
        do {
          auVar11._0_8_ =
               (double)(this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[*local_38._M_head_impl];
          auVar11._8_8_ = in_XMM3_Qb;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (this->pi)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl
                         [*(local_38._M_head_impl + 4)];
          auVar7 = vfmadd231sd_fma(auVar7,auVar11,auVar1);
          dVar10 = auVar7._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (this->P)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl[*local_38._M_head_impl]
          ;
          auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar2);
          dVar8 = auVar9._0_8_;
          local_38._M_head_impl = local_38._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      prVar4 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data_*,_false>
               ._M_head_impl;
      prVar4[uVar6].id = (int)uVar6;
      dVar8 = ((this->c->linear_elements)._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl[begin->column] - dVar10) - dVar8;
      prVar4[uVar6].value = dVar8;
      iVar3 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[begin->value];
      prVar4[uVar6].f = iVar3;
      if (iVar3 < 0) {
        auVar7._8_8_ = 0x8000000000000000;
        auVar7._0_8_ = 0x8000000000000000;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar8;
        auVar7 = vxorpd_avx512vl(auVar9,auVar7);
        dVar8 = (double)vmovlpd_avx(auVar7);
        prVar4[uVar6].value = dVar8;
        rVar5.r_size = rVar5.r_size + 1;
        rVar5.c_size = 0;
      }
      uVar6 = uVar6 + 1;
      begin = begin + 1;
    } while (begin != end);
    rVar5 = (rc_size)((long)rVar5 << 0x20 | uVar6 & 0xffffffff);
  }
  return rVar5;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A[std::get<0>(ht)->value]);

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A[begin->value];

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }